

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  time_t tVar1;
  shared_ptr<Instance> instance;
  LoadingInstance loadInstance;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_278;
  GeneticAlgorithm geneticAlgorithm;
  Result result;
  ifstream m50n1000;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  loadInstance.in = (istream *)&std::cin;
  geneticAlgorithm.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (_func_int **)&PTR__GeneticAlgorithm_00109bb8;
  geneticAlgorithm.population.
  super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  geneticAlgorithm.population.
  super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  geneticAlgorithm.destinatedPopulationSize = 100;
  std::ifstream::ifstream(&m50n1000,"Instances/m50",_S_in);
  result.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  result.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  result.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  result.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::make_shared<Instance,Instance>((Instance *)&instance);
  std::_Vector_base<Task,_std::allocator<Task>_>::~_Vector_base
            ((_Vector_base<Task,_std::allocator<Task>_> *)&result);
  loadInstance.in = (istream *)&m50n1000;
  LoadingInstance::Build
            (&loadInstance,instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  operator<<((ostream *)&std::cout,
             instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_278,&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  GeneticAlgorithm::operator()(&result,&geneticAlgorithm,(shared_ptr<Instance> *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
  Result::showyourself(&result);
  Result::~Result(&result);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::ifstream::~ifstream(&m50n1000);
  GeneticAlgorithm::~GeneticAlgorithm(&geneticAlgorithm);
  return 0;
}

Assistant:

int main(){
	//Seed for srand
	srand( time (NULL) );
	//Create needed objects
    LoadingInstance loadInstance;

	GeneticAlgorithm geneticAlgorithm;

	std::ifstream m50n1000("Instances/m50");

	auto instance = std::make_shared<Instance>( Instance() );

	//Load data
	loadInstance.SetSource(m50n1000);
	loadInstance.Build(*instance);
   	std::cout << *instance;

	auto result = geneticAlgorithm(instance);
	result.showyourself();

    return 0;
}